

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

string * __thiscall
deqp::sl::ShaderCase::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  DataType DVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  pointer pVVar9;
  long lVar10;
  ostringstream res;
  ValueBlock *local_1d8;
  char *local_1d0;
  char *local_1c8;
  string *local_1c0;
  char *local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [376];
  
  local_1d8 = valueBlock;
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar7 = (ulong)this->m_targetVersion;
  if (uVar7 < 7) {
    local_1d0 = *(char **)(&DAT_0210b630 + uVar7 * 8);
    pcVar6 = *(char **)(&DAT_0210b668 + uVar7 * 8);
  }
  else {
    pcVar6 = "out";
    local_1d0 = "in";
  }
  pcVar2 = glu::getGLSLVersionDeclaration(this->m_targetVersion);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp int;\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  pcVar2 = local_1d0;
  local_1b0 = strlen(local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," highp vec4 dEQP_Position;\n",0x1b);
  pVVar9 = (local_1d8->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = pcVar6;
  if (0 < (int)((ulong)((long)(local_1d8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) >> 3) *
          0x38e38e39) {
    lVar5 = 0x28;
    lVar8 = 0;
    do {
      if (*(int *)((long)pVVar9 + lVar5 + -0x28) == 1) {
        DVar1 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar9->storageType + lVar5));
        local_1c8 = glu::getDataTypeName(DVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1d0,local_1b0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        pcVar6 = local_1c8;
        if (local_1c8 == (char *)0x0) {
          std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
        }
        else {
          sVar3 = strlen(local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," a_",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar9 + lVar5 + -0x20),
                            *(long *)((long)pVVar9 + lVar5 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
        DVar1 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar9->storageType + lVar5));
        pcVar6 = local_1b8;
        sVar3 = strlen(local_1b8);
        if (DVar1 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          pcVar6 = local_1c8;
          if (local_1c8 == (char *)0x0) {
            lVar10 = 1;
            std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
            pcVar6 = " ";
          }
          else {
            sVar3 = strlen(local_1c8);
            lVar10 = 1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
            pcVar6 = " ";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          pcVar6 = local_1c8;
          if (local_1c8 == (char *)0x0) {
            lVar10 = 3;
            std::ios::clear((int)&local_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
            pcVar6 = " v_";
          }
          else {
            sVar3 = strlen(local_1c8);
            lVar10 = 3;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar3);
            pcVar6 = " v_";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar9 + lVar5 + -0x20),
                            *(long *)((long)pVVar9 + lVar5 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      }
      lVar8 = lVar8 + 1;
      pVVar9 = (local_1d8->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x48;
    } while (lVar8 < (int)((ulong)((long)(local_1d8->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9)
                          >> 3) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position = dEQP_Position;\n",0x21);
  pVVar9 = (local_1d8->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_1d8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) >> 3) *
          0x38e38e39) {
    lVar8 = 0;
    lVar5 = 0;
    do {
      if (*(int *)((long)&pVVar9->storageType + lVar8) == 1) {
        DVar1 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar9->dataType + lVar8));
        if (DVar1 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,
                              *(char **)((long)&(pVVar9->valueName)._M_dataplus._M_p + lVar8),
                              *(long *)((long)&(pVVar9->valueName)._M_string_length + lVar8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = a_",5);
          lVar10 = lVar8;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    v_",6);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,
                              *(char **)((long)&(pVVar9->valueName)._M_dataplus._M_p + lVar8),
                              *(long *)((long)&(pVVar9->valueName)._M_string_length + lVar8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = a_",5);
          lVar10 = lVar5 * 0x48;
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,*(char **)((long)&(pVVar9->valueName)._M_dataplus._M_p + lVar8),
                            *(long *)((long)&(pVVar9->valueName)._M_string_length + lVar10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
      }
      lVar5 = lVar5 + 1;
      pVVar9 = (local_1d8->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x48;
    } while (lVar5 < (int)((ulong)((long)(local_1d8->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9)
                          >> 3) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1c0;
}

Assistant:

string ShaderCase::genVertexShader(const ValueBlock& valueBlock)
{
	ostringstream res;
	const bool	usesInout = usesShaderInoutQualifiers(m_targetVersion);
	const char*   vtxIn		= usesInout ? "in" : "attribute";
	const char*   vtxOut	= usesInout ? "out" : "varying";

	res << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	// Declarations (position + attribute/varying for each input).
	res << "precision highp float;\n";
	res << "precision highp int;\n";
	res << "\n";
	res << vtxIn << " highp vec4 dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			DataType	floatType = getDataTypeFloatScalars(val.dataType);
			const char* typeStr   = getDataTypeName(floatType);
			res << vtxIn << " " << typeStr << " a_" << val.valueName << ";\n";

			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << vtxOut << " " << typeStr << " " << val.valueName << ";\n";
			else
				res << vtxOut << " " << typeStr << " v_" << val.valueName << ";\n";
		}
	}
	res << "\n";

	// Main function.
	// - gl_Position = dEQP_Position;
	// - for each input: write attribute directly to varying
	res << "void main()\n";
	res << "{\n";
	res << "    gl_Position = dEQP_Position;\n";
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val = valueBlock.values[ndx];
		if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
		{
			const string& name = val.valueName;
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				res << "    " << name << " = a_" << name << ";\n";
			else
				res << "    v_" << name << " = a_" << name << ";\n";
		}
	}

	res << "}\n";
	return res.str();
}